

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O3

XrResult GenValidUsageInputsXrApplyHapticFeedback
                   (XrSession session,XrHapticActionInfo *hapticActionInfo,
                   XrHapticBaseHeader *hapticFeedback)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  ValidateXrHandleResult VVar3;
  XrResult XVar4;
  XrStructureType XVar5;
  char *pcVar6;
  long lVar7;
  GenValidUsageXrInstanceInfo *instance_info;
  ulong uVar8;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar9;
  string out;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> objects_info;
  ostringstream oss;
  string local_2e8;
  string local_2c8;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_2a8;
  XrSession local_288;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_280;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_268;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_250;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_238;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_220;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_208;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1f0;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1d8;
  string local_1c0 [3];
  ios_base local_150 [264];
  string local_48;
  
  local_2a8.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a8.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2a8.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c0[0]._M_dataplus._M_p._0_4_ = 2;
  local_288 = session;
  std::vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>>::
  emplace_back<XrSession_T*&,XrObjectType>
            ((vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>> *)
             &local_2a8,&local_288,(XrObjectType *)local_1c0);
  VVar3 = VerifyXrSessionHandle(&local_288);
  if (VVar3 != VALIDATE_XR_HANDLE_SUCCESS) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c0,"Invalid XrSession handle \"session\" ",0x23);
    local_2c8._M_dataplus._M_p = (pointer)local_288;
    paVar1 = &local_2e8.field_2;
    local_2e8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_2e8,'\x12');
    *local_2e8._M_dataplus._M_p = '0';
    local_2e8._M_dataplus._M_p[1] = 'x';
    pcVar6 = local_2e8._M_dataplus._M_p + (local_2e8._M_string_length - 1);
    lVar7 = 0;
    do {
      bVar2 = *(byte *)((long)&local_2c8._M_dataplus._M_p + lVar7);
      *pcVar6 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 & 0xf];
      pcVar6[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 >> 4];
      lVar7 = lVar7 + 1;
      pcVar6 = pcVar6 + -2;
    } while (lVar7 != 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c0,local_2e8._M_dataplus._M_p,local_2e8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_dataplus._M_p != paVar1) {
      operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
    }
    local_2e8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2e8,"VUID-xrApplyHapticFeedback-session-parameter","");
    local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"xrApplyHapticFeedback","")
    ;
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_1d8,&local_2a8);
    std::__cxx11::stringbuf::str();
    CoreValidLogMessage((GenValidUsageXrInstanceInfo *)0x0,&local_2e8,
                        VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_2c8,&local_1d8,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if (local_1d8.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1d8.
                      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1d8.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1d8.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
      operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_dataplus._M_p != paVar1) {
      operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
    std::ios_base::~ios_base(local_150);
    XVar4 = XR_ERROR_HANDLE_INVALID;
    goto LAB_0022ca28;
  }
  pVar9 = HandleInfo<XrSession_T_*>::getWithInstanceInfo(&g_session_info,local_288);
  instance_info = pVar9.second;
  paVar1 = &local_1c0[0].field_2;
  local_1c0[0]._M_dataplus._M_p = (pointer)paVar1;
  if (hapticActionInfo == (XrHapticActionInfo *)0x0) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1c0,"VUID-xrApplyHapticFeedback-hapticActionInfo-parameter","");
    local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"xrApplyHapticFeedback","")
    ;
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_1f0,&local_2a8);
    local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2c8,
               "Invalid NULL for XrHapticActionInfo \"hapticActionInfo\" which is not optional and must be non-NULL"
               ,"");
    CoreValidLogMessage(instance_info,local_1c0,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_2e8,
                        &local_1f0,&local_2c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
      operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
    }
joined_r0x0022c9de:
    if (local_1f0.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      uVar8 = (long)local_1f0.
                    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
              (long)local_1f0.
                    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start;
LAB_0022c9eb:
      operator_delete(local_1f0.
                      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start,uVar8);
    }
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"xrApplyHapticFeedback","");
    XVar4 = ValidateXrStruct(instance_info,local_1c0,&local_2a8,true,true,hapticActionInfo);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_1c0[0]._M_dataplus._M_p,local_1c0[0].field_2._M_allocated_capacity + 1);
    }
    if (XVar4 != XR_SUCCESS) {
      local_1c0[0]._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1c0,"VUID-xrApplyHapticFeedback-hapticActionInfo-parameter","");
      local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2e8,"xrApplyHapticFeedback","");
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_208,&local_2a8);
      local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2c8,
                 "Command xrApplyHapticFeedback param hapticActionInfo is invalid","");
      CoreValidLogMessage(instance_info,local_1c0,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_2e8,
                          &local_208,&local_2c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
        operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
      }
      if (local_208.
          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_208.
                        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_208.
                              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_208.
                              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
        operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_1c0[0]._M_dataplus._M_p,local_1c0[0].field_2._M_allocated_capacity + 1
                       );
      }
      goto LAB_0022ca28;
    }
    if (hapticFeedback == (XrHapticBaseHeader *)0x0) {
      local_1c0[0]._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1c0,"VUID-xrApplyHapticFeedback-hapticFeedback-parameter","");
      local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2e8,"xrApplyHapticFeedback","");
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_220,&local_2a8);
      local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2c8,
                 "Invalid NULL for XrHapticBaseHeader \"hapticFeedback\" which is not optional and must be non-NULL"
                 ,"");
      CoreValidLogMessage(instance_info,local_1c0,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_2e8,
                          &local_220,&local_2c8);
      local_1f0.
      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
      _M_impl.super__Vector_impl_data._M_start =
           local_220.
           super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_1f0.
      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           local_220.
           super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
        operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
        local_1f0.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_start =
             local_220.
             super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_1f0.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             local_220.
             super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
      }
      goto joined_r0x0022c9de;
    }
    XVar5 = hapticFeedback->type;
    if (XVar5 != XR_TYPE_HAPTIC_VIBRATION) {
LAB_0022cc5f:
      if (XVar5 == XR_TYPE_HAPTIC_AMPLITUDE_ENVELOPE_VIBRATION_FB) {
        local_1c0[0]._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1c0,"xrApplyHapticFeedback","");
        XVar4 = ValidateXrStruct(instance_info,local_1c0,&local_2a8,false,true,
                                 (XrHapticAmplitudeEnvelopeVibrationFB *)hapticFeedback);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0[0]._M_dataplus._M_p != paVar1) {
          operator_delete(local_1c0[0]._M_dataplus._M_p,
                          local_1c0[0].field_2._M_allocated_capacity + 1);
        }
        if (XVar4 != XR_SUCCESS) {
          local_1c0[0]._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1c0,"Command xrApplyHapticFeedback param hapticFeedback","");
          std::__cxx11::string::append((char *)local_1c0);
          local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2e8,"VUID-xrApplyHapticFeedback-hapticFeedback-parameter","");
          local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2c8,"xrApplyHapticFeedback","");
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    (&local_250,&local_2a8);
          CoreValidLogMessage(instance_info,&local_2e8,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_2c8,
                              &local_250,local_1c0);
          local_238.
          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_start =
               local_250.
               super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_238.
          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               local_250.
               super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          goto joined_r0x0022cd83;
        }
        XVar5 = hapticFeedback->type;
      }
      if (XVar5 == XR_TYPE_HAPTIC_PCM_VIBRATION_FB) {
        local_1c0[0]._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1c0,"xrApplyHapticFeedback","");
        XVar4 = ValidateXrStruct(instance_info,local_1c0,&local_2a8,false,true,
                                 (XrHapticPcmVibrationFB *)hapticFeedback);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0[0]._M_dataplus._M_p != paVar1) {
          operator_delete(local_1c0[0]._M_dataplus._M_p,
                          local_1c0[0].field_2._M_allocated_capacity + 1);
        }
        if (XVar4 != XR_SUCCESS) {
          local_1c0[0]._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1c0,"Command xrApplyHapticFeedback param hapticFeedback","");
          std::__cxx11::string::append((char *)local_1c0);
          local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2e8,"VUID-xrApplyHapticFeedback-hapticFeedback-parameter","");
          local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2c8,"xrApplyHapticFeedback","");
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    (&local_268,&local_2a8);
          CoreValidLogMessage(instance_info,&local_2e8,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_2c8,
                              &local_268,local_1c0);
          local_238.
          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_start =
               local_268.
               super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_238.
          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               local_268.
               super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          goto joined_r0x0022cd83;
        }
      }
      local_1c0[0]._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1c0,"xrApplyHapticFeedback","");
      XVar4 = ValidateXrStruct(instance_info,local_1c0,&local_2a8,true,false,hapticFeedback);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_1c0[0]._M_dataplus._M_p,local_1c0[0].field_2._M_allocated_capacity + 1
                       );
      }
      if (XVar4 == XR_SUCCESS) {
        XVar4 = XR_SUCCESS;
        goto LAB_0022ca28;
      }
      local_1c0[0]._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1c0,"VUID-xrApplyHapticFeedback-hapticFeedback-parameter","");
      local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2e8,"xrApplyHapticFeedback","");
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_280,&local_2a8);
      local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2c8,
                 "Command xrApplyHapticFeedback param hapticFeedback is invalid","");
      CoreValidLogMessage(instance_info,local_1c0,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_2e8,
                          &local_280,&local_2c8);
      local_1f0.
      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
      _M_impl.super__Vector_impl_data._M_start =
           local_280.
           super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_1f0.
      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           local_280.
           super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
        operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
        local_1f0.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_start =
             local_280.
             super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_1f0.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             local_280.
             super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
      }
      goto joined_r0x0022c9de;
    }
    local_1c0[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"xrApplyHapticFeedback","");
    XVar4 = ValidateXrStruct(instance_info,local_1c0,&local_2a8,false,true,
                             (XrHapticVibration *)hapticFeedback);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_1c0[0]._M_dataplus._M_p,local_1c0[0].field_2._M_allocated_capacity + 1);
    }
    if (XVar4 == XR_SUCCESS) {
      XVar5 = hapticFeedback->type;
      goto LAB_0022cc5f;
    }
    local_1c0[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1c0,"Command xrApplyHapticFeedback param hapticFeedback","");
    std::__cxx11::string::append((char *)local_1c0);
    local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2e8,"VUID-xrApplyHapticFeedback-hapticFeedback-parameter","");
    local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"xrApplyHapticFeedback","")
    ;
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_238,&local_2a8);
    CoreValidLogMessage(instance_info,&local_2e8,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_2c8,
                        &local_238,local_1c0);
joined_r0x0022cd83:
    if (local_238.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_238.
                      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_238.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_238.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
      uVar8 = local_2c8.field_2._M_allocated_capacity + 1;
      local_1f0.
      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)local_2c8._M_dataplus._M_p;
      goto LAB_0022c9eb;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c0[0]._M_dataplus._M_p,local_1c0[0].field_2._M_allocated_capacity + 1);
  }
  XVar4 = XR_ERROR_VALIDATION_FAILURE;
LAB_0022ca28:
  if (local_2a8.
      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2a8.
                    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2a8.
                          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2a8.
                          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return XVar4;
}

Assistant:

XrResult GenValidUsageInputsXrApplyHapticFeedback(
XrSession session,
const XrHapticActionInfo* hapticActionInfo,
const XrHapticBaseHeader* hapticFeedback) {
    try {
        XrResult xr_result = XR_SUCCESS;
        std::vector<GenValidUsageXrObjectInfo> objects_info;
        objects_info.emplace_back(session, XR_OBJECT_TYPE_SESSION);

        {
            // writeValidateInlineHandleValidation
            ValidateXrHandleResult handle_result = VerifyXrSessionHandle(&session);
            if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                // Not a valid handle or NULL (which is not valid in this case)
                std::ostringstream oss;
                oss << "Invalid XrSession handle \"session\" ";
                oss << HandleToHexString(session);
                CoreValidLogMessage(nullptr, "VUID-xrApplyHapticFeedback-session-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrApplyHapticFeedback",
                                    objects_info, oss.str());
                return XR_ERROR_HANDLE_INVALID;
            }
        }
        auto info_with_instance = g_session_info.getWithInstanceInfo(session);
        GenValidUsageXrHandleInfo *gen_session_info = info_with_instance.first;
        (void)gen_session_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        (void)gen_instance_info;  // quiet warnings
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == hapticActionInfo) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrApplyHapticFeedback-hapticActionInfo-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrApplyHapticFeedback", objects_info,
                                "Invalid NULL for XrHapticActionInfo \"hapticActionInfo\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Validate that the structure XrHapticActionInfo is valid
        xr_result = ValidateXrStruct(gen_instance_info, "xrApplyHapticFeedback", objects_info,
                                                        true, true, hapticActionInfo);
        if (XR_SUCCESS != xr_result) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrApplyHapticFeedback-hapticActionInfo-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrApplyHapticFeedback",
                                objects_info,
                                "Command xrApplyHapticFeedback param hapticActionInfo is invalid");
            return xr_result;
        }
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == hapticFeedback) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrApplyHapticFeedback-hapticFeedback-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrApplyHapticFeedback", objects_info,
                                "Invalid NULL for XrHapticBaseHeader \"hapticFeedback\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Validate if XrHapticBaseHeader is a child structure of type XrHapticVibration and it is valid
        {
            const XrHapticVibration* new_hapticvibration_value = reinterpret_cast<const XrHapticVibration*>(hapticFeedback);
            if (new_hapticvibration_value->type == XR_TYPE_HAPTIC_VIBRATION) {
                xr_result = ValidateXrStruct(gen_instance_info, "xrApplyHapticFeedback",
                                                                objects_info,false, true, new_hapticvibration_value);
                if (XR_SUCCESS != xr_result) {
                    std::string error_message = "Command xrApplyHapticFeedback param hapticFeedback";
                    error_message += " is invalid";
                    CoreValidLogMessage(gen_instance_info, "VUID-xrApplyHapticFeedback-hapticFeedback-parameter",
                                        VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrApplyHapticFeedback",
                                        objects_info,
                                        error_message);
                    return XR_ERROR_VALIDATION_FAILURE;
                }
            }
        }
        // Validate if XrHapticBaseHeader is a child structure of type XrHapticAmplitudeEnvelopeVibrationFB and it is valid
        {
            const XrHapticAmplitudeEnvelopeVibrationFB* new_hapticamplitudeenvelopevibrationfb_value = reinterpret_cast<const XrHapticAmplitudeEnvelopeVibrationFB*>(hapticFeedback);
            if (new_hapticamplitudeenvelopevibrationfb_value->type == XR_TYPE_HAPTIC_AMPLITUDE_ENVELOPE_VIBRATION_FB) {
                xr_result = ValidateXrStruct(gen_instance_info, "xrApplyHapticFeedback",
                                                                objects_info,false, true, new_hapticamplitudeenvelopevibrationfb_value);
                if (XR_SUCCESS != xr_result) {
                    std::string error_message = "Command xrApplyHapticFeedback param hapticFeedback";
                    error_message += " is invalid";
                    CoreValidLogMessage(gen_instance_info, "VUID-xrApplyHapticFeedback-hapticFeedback-parameter",
                                        VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrApplyHapticFeedback",
                                        objects_info,
                                        error_message);
                    return XR_ERROR_VALIDATION_FAILURE;
                }
            }
        }
        // Validate if XrHapticBaseHeader is a child structure of type XrHapticPcmVibrationFB and it is valid
        {
            const XrHapticPcmVibrationFB* new_hapticpcmvibrationfb_value = reinterpret_cast<const XrHapticPcmVibrationFB*>(hapticFeedback);
            if (new_hapticpcmvibrationfb_value->type == XR_TYPE_HAPTIC_PCM_VIBRATION_FB) {
                xr_result = ValidateXrStruct(gen_instance_info, "xrApplyHapticFeedback",
                                                                objects_info,false, true, new_hapticpcmvibrationfb_value);
                if (XR_SUCCESS != xr_result) {
                    std::string error_message = "Command xrApplyHapticFeedback param hapticFeedback";
                    error_message += " is invalid";
                    CoreValidLogMessage(gen_instance_info, "VUID-xrApplyHapticFeedback-hapticFeedback-parameter",
                                        VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrApplyHapticFeedback",
                                        objects_info,
                                        error_message);
                    return XR_ERROR_VALIDATION_FAILURE;
                }
            }
        }
        // Validate that the base-structure XrHapticBaseHeader is valid
        xr_result = ValidateXrStruct(gen_instance_info, "xrApplyHapticFeedback", objects_info,
                                                        true, true, hapticFeedback);
        if (XR_SUCCESS != xr_result) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrApplyHapticFeedback-hapticFeedback-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrApplyHapticFeedback",
                                objects_info,
                                "Command xrApplyHapticFeedback param hapticFeedback is invalid");
            return xr_result;
        }
        return xr_result;
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
}